

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::AddArrayLink
          (UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *this)

{
  UnorderedArrayListLink *pUVar1;
  SnapObject *pSVar2;
  SnapObject *newBlockData;
  UnorderedArrayListLink *copiedOldBlock;
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *this_local;
  
  pUVar1 = SlabAllocatorBase<0>::
           SlabAllocateStruct<TTD::UnorderedArrayList<TTD::NSSnapObjects::SnapObject,4096ul>::UnorderedArrayListLink>
                     (this->m_alloc);
  pUVar1->CurrPos = (this->m_inlineHeadBlock).CurrPos;
  pUVar1->EndPos = (this->m_inlineHeadBlock).EndPos;
  pUVar1->BlockData = (this->m_inlineHeadBlock).BlockData;
  pUVar1->Next = (this->m_inlineHeadBlock).Next;
  pSVar2 = SlabAllocatorBase<0>::SlabAllocateFixedSizeArray<TTD::NSSnapObjects::SnapObject,4096ul>
                     (this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pSVar2;
  (this->m_inlineHeadBlock).CurrPos = pSVar2;
  (this->m_inlineHeadBlock).EndPos = pSVar2 + 0x1000;
  (this->m_inlineHeadBlock).Next = pUVar1;
  return;
}

Assistant:

void AddArrayLink()
        {
            UnorderedArrayListLink* copiedOldBlock = this->m_alloc->template SlabAllocateStruct<UnorderedArrayListLink>();
            *copiedOldBlock = this->m_inlineHeadBlock;

            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = copiedOldBlock;
        }